

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom js_atom_concat_str(JSContext *ctx,JSAtom name,char *str1)

{
  JSValue val1;
  JSValue v;
  int iVar1;
  JSAtom JVar2;
  char *str_00;
  void *__dest;
  char *in_RDX;
  JSValue JVar3;
  size_t len1;
  size_t len;
  char *cstr2;
  char *cstr;
  JSAtom atom;
  JSValue str;
  undefined1 in_stack_ffffffffffffff98 [16];
  JSContext *pJVar4;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSContext *in_stack_ffffffffffffffb0;
  JSContext *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  JVar3 = JS_AtomToString(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._4_4_);
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    val1.tag = (int64_t)in_stack_ffffffffffffffb0;
    val1.u.ptr = in_stack_ffffffffffffffa8.ptr;
    str_00 = JS_ToCStringLen((JSContext *)JVar3.tag,(size_t *)JVar3.u.ptr,val1);
    pJVar4 = (JSContext *)JVar3.tag;
    if (str_00 != (char *)0x0) {
      in_stack_ffffffffffffffa8 = (JSValueUnion)strlen(in_RDX);
      __dest = js_malloc(in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
      pJVar4 = (JSContext *)JVar3.tag;
      if (__dest != (void *)0x0) {
        memcpy(__dest,str_00,(size_t)in_stack_ffffffffffffffb0);
        memcpy((void *)((long)__dest + (long)in_stack_ffffffffffffffb0),in_RDX,
               (size_t)in_stack_ffffffffffffffa8);
        *(undefined1 *)
         ((long)__dest +
         (long)&(in_stack_ffffffffffffffb0->header).ref_count + (long)in_stack_ffffffffffffffa8.ptr)
             = 0;
        JVar2 = JS_NewAtomLen((JSContext *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),str_00,
                              (size_t)__dest);
        pJVar4 = (JSContext *)JVar3.tag;
        js_free(pJVar4,JVar3.u.ptr);
        JS_FreeCString(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.ptr);
        JVar3.tag = (int64_t)in_stack_ffffffffffffffb0;
        JVar3.u.ptr = in_stack_ffffffffffffffa8.ptr;
        JS_FreeValue(pJVar4,JVar3);
        return JVar2;
      }
    }
    JS_FreeCString(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8.ptr);
    v.tag = (int64_t)in_stack_ffffffffffffffb0;
    v.u.ptr = in_stack_ffffffffffffffa8.ptr;
    JS_FreeValue(pJVar4,v);
  }
  return 0;
}

Assistant:

static JSAtom js_atom_concat_str(JSContext *ctx, JSAtom name, const char *str1)
{
    JSValue str;
    JSAtom atom;
    const char *cstr;
    char *cstr2;
    size_t len, len1;
    
    str = JS_AtomToString(ctx, name);
    if (JS_IsException(str))
        return JS_ATOM_NULL;
    cstr = JS_ToCStringLen(ctx, &len, str);
    if (!cstr)
        goto fail;
    len1 = strlen(str1);
    cstr2 = js_malloc(ctx, len + len1 + 1);
    if (!cstr2)
        goto fail;
    memcpy(cstr2, cstr, len);
    memcpy(cstr2 + len, str1, len1);
    cstr2[len + len1] = '\0';
    atom = JS_NewAtomLen(ctx, cstr2, len + len1);
    js_free(ctx, cstr2);
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return atom;
 fail:
    JS_FreeCString(ctx, cstr);
    JS_FreeValue(ctx, str);
    return JS_ATOM_NULL;
}